

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall TArray<StyleName,_StyleName>::ShrinkToFit(TArray<StyleName,_StyleName> *this)

{
  uint uVar1;
  StyleName *pSVar2;
  
  uVar1 = this->Count;
  if (uVar1 < this->Most) {
    this->Most = uVar1;
    if (uVar1 == 0) {
      if (this->Array == (StyleName *)0x0) {
        return;
      }
      M_Free(this->Array);
      pSVar2 = (StyleName *)0x0;
    }
    else {
      pSVar2 = (StyleName *)
               M_Realloc_Dbg(this->Array,(ulong)uVar1 * 0x15,
                             "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                             ,0x1ad);
    }
    this->Array = pSVar2;
  }
  return;
}

Assistant:

void ShrinkToFit ()
	{
		if (Most > Count)
		{
			Most = Count;
			if (Most == 0)
			{
				if (Array != NULL)
				{
					M_Free (Array);
					Array = NULL;
				}
			}
			else
			{
				DoResize ();
			}
		}
	}